

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::Render(void)

{
  ImVector<ImGuiViewportP_*> *this;
  int *piVar1;
  ImVec2 IVar2;
  uint uVar3;
  ImGuiViewportP *pIVar4;
  ImGuiWindow *window;
  undefined1 auVar5 [16];
  ushort uVar6;
  ImGuiContext *ctx;
  ImGuiWindow *pIVar7;
  uint uVar8;
  ImGuiViewportP **ppIVar9;
  ImDrawList *pIVar10;
  ImGuiWindow **ppIVar11;
  ImGuiIO *pIVar12;
  ImDrawList **ppIVar13;
  int n;
  int iVar14;
  ulong uVar15;
  ImGuiWindow *pIVar16;
  int n_2;
  long lVar17;
  int iVar18;
  int iVar19;
  float fVar20;
  float fVar21;
  ImRect IVar22;
  ImVec2 local_90;
  ImGuiWindow *windows_to_render_top_most [2];
  ImVec2 local_70;
  undefined1 local_68 [16];
  ImVec2 mouse_cursor_uv [4];
  
  ctx = GImGui;
  if (GImGui->Initialized != false) {
    iVar14 = GImGui->FrameCountEnded;
    if (iVar14 != GImGui->FrameCount) {
      EndFrame();
      iVar14 = ctx->FrameCount;
    }
    ctx->FrameCountRendered = iVar14;
    (ctx->IO).MetricsRenderWindows = 0;
    CallContextHooks(ctx,ImGuiContextHookType_RenderPre);
    this = &ctx->Viewports;
    for (iVar14 = 0; iVar14 != this->Size; iVar14 = iVar14 + 1) {
      ppIVar9 = ImVector<ImGuiViewportP_*>::operator[](this,iVar14);
      pIVar4 = *ppIVar9;
      ImDrawDataBuilder::Clear(&pIVar4->DrawDataBuilder);
      if (pIVar4->DrawLists[0] != (ImDrawList *)0x0) {
        pIVar10 = GetBackgroundDrawList(&pIVar4->super_ImGuiViewport);
        AddDrawListToDrawData((pIVar4->DrawDataBuilder).Layers,pIVar10);
      }
    }
    pIVar16 = ctx->NavWindowingTarget;
    if (pIVar16 == (ImGuiWindow *)0x0) {
      windows_to_render_top_most[0] = (ImGuiWindow *)0x0;
      pIVar16 = (ImGuiWindow *)0x0;
    }
    else {
      if ((pIVar16->Flags & 0x2000) == 0) {
        windows_to_render_top_most[0] = pIVar16->RootWindowDockTree;
      }
      else {
        windows_to_render_top_most[0] = (ImGuiWindow *)0x0;
      }
      pIVar16 = ctx->NavWindowingListWindow;
    }
    pIVar7 = windows_to_render_top_most[0];
    windows_to_render_top_most[1] = pIVar16;
    for (iVar14 = 0; iVar14 != (ctx->Windows).Size; iVar14 = iVar14 + 1) {
      ppIVar11 = ImVector<ImGuiWindow_*>::operator[](&ctx->Windows,iVar14);
      window = *ppIVar11;
      if (((window->Active == true) && (window->Hidden == false)) &&
         ((window != pIVar16 && window != pIVar7) && (window->Flags & 0x1000000) == 0)) {
        AddRootWindowToDrawData(window);
      }
    }
    for (lVar17 = 0; lVar17 != 2; lVar17 = lVar17 + 1) {
      pIVar16 = windows_to_render_top_most[lVar17];
      if (((pIVar16 != (ImGuiWindow *)0x0) && (pIVar16->Active == true)) &&
         (pIVar16->Hidden == false)) {
        AddRootWindowToDrawData(pIVar16);
      }
    }
    local_70.x = 0.0;
    local_70.y = 0.0;
    local_90.x = 0.0;
    local_90.y = 0.0;
    mouse_cursor_uv[2].x = 0.0;
    mouse_cursor_uv[2].y = 0.0;
    mouse_cursor_uv[3].x = 0.0;
    mouse_cursor_uv[3].y = 0.0;
    mouse_cursor_uv[0].x = 0.0;
    mouse_cursor_uv[0].y = 0.0;
    mouse_cursor_uv[1].x = 0.0;
    mouse_cursor_uv[1].y = 0.0;
    if (((ctx->IO).MouseDrawCursor != false) && (ctx->MouseCursor != -1)) {
      ImFontAtlas::GetMouseCursorTexData
                ((ctx->IO).Fonts,ctx->MouseCursor,&local_70,&local_90,mouse_cursor_uv,
                 mouse_cursor_uv + 2);
    }
    (ctx->IO).MetricsRenderVertices = 0;
    (ctx->IO).MetricsRenderIndices = 0;
    for (iVar14 = 0; iVar14 < this->Size; iVar14 = iVar14 + 1) {
      ppIVar9 = ImVector<ImGuiViewportP_*>::operator[](this,iVar14);
      pIVar4 = *ppIVar9;
      ImDrawDataBuilder::FlattenIntoSingleLayer(&pIVar4->DrawDataBuilder);
      if ((0.0 < local_90.x) && (0.0 < local_90.y)) {
        local_68 = ZEXT416((uint)((ctx->Style).MouseCursorScale *
                                 (pIVar4->super_ImGuiViewport).DpiScale));
        IVar22 = ImGuiViewportP::GetMainRect(pIVar4);
        IVar2 = (ctx->IO).MousePos;
        fVar20 = IVar2.x;
        fVar21 = IVar2.y;
        uVar6 = -(ushort)(fVar21 < IVar22.Max.y);
        if (((uVar6 & 1) != 0) &&
           (((iVar18 = -(uint)(IVar22.Min.x < (float)local_68._0_4_ * (local_90.x + 2.0) + fVar20),
             iVar19 = -(uint)(IVar22.Min.y < (float)local_68._0_4_ * (local_90.y + 2.0) + fVar21),
             auVar5._4_4_ = iVar18, auVar5._0_4_ = iVar18, auVar5._8_4_ = iVar19,
             auVar5._12_4_ = iVar19, uVar8 = movmskpd((uint)uVar6,auVar5),
             (byte)((byte)uVar8 >> 1) != 0 && (fVar20 < IVar22.Max.x)) && ((uVar8 & 1) != 0)))) {
          pIVar10 = GetForegroundDrawList(&pIVar4->super_ImGuiViewport);
          RenderMouseCursor(pIVar10,(ctx->IO).MousePos,(float)local_68._0_4_,ctx->MouseCursor,
                            0xffffffff,0xff000000,0x30000000);
        }
      }
      if (pIVar4->DrawLists[1] != (ImDrawList *)0x0) {
        pIVar10 = GetForegroundDrawList(&pIVar4->super_ImGuiViewport);
        AddDrawListToDrawData((pIVar4->DrawDataBuilder).Layers,pIVar10);
      }
      uVar8 = (pIVar4->super_ImGuiViewport).Flags;
      pIVar12 = GetIO();
      (pIVar4->super_ImGuiViewport).DrawData = &pIVar4->DrawDataP;
      (pIVar4->DrawDataP).Valid = true;
      uVar3 = (pIVar4->DrawDataBuilder).Layers[0].Size;
      if ((int)uVar3 < 1) {
        ppIVar13 = (ImDrawList **)0x0;
      }
      else {
        ppIVar13 = (pIVar4->DrawDataBuilder).Layers[0].Data;
      }
      (pIVar4->DrawDataP).TotalIdxCount = 0;
      (pIVar4->DrawDataP).TotalVtxCount = 0;
      (pIVar4->DrawDataP).CmdLists = ppIVar13;
      (pIVar4->DrawDataP).CmdListsCount = uVar3;
      (pIVar4->DrawDataP).DisplayPos = (pIVar4->super_ImGuiViewport).Pos;
      fVar20 = 0.0;
      fVar21 = 0.0;
      if ((uVar8 >> 10 & 1) == 0) {
        IVar2 = (pIVar4->super_ImGuiViewport).Size;
        fVar20 = IVar2.x;
        fVar21 = IVar2.y;
      }
      IVar2.y = fVar21;
      IVar2.x = fVar20;
      (pIVar4->DrawDataP).DisplaySize = IVar2;
      (pIVar4->DrawDataP).FramebufferScale = pIVar12->DisplayFramebufferScale;
      (pIVar4->DrawDataP).OwnerViewport = &pIVar4->super_ImGuiViewport;
      iVar18 = 0;
      if ((int)uVar3 < 1) {
        uVar3 = 0;
      }
      iVar19 = 0;
      for (uVar15 = 0; uVar3 != uVar15; uVar15 = uVar15 + 1) {
        pIVar10 = (pIVar4->DrawDataBuilder).Layers[0].Data[uVar15];
        iVar19 = iVar19 + (pIVar10->VtxBuffer).Size;
        (pIVar4->DrawDataP).TotalVtxCount = iVar19;
        iVar18 = iVar18 + (pIVar10->IdxBuffer).Size;
        (pIVar4->DrawDataP).TotalIdxCount = iVar18;
      }
      piVar1 = &(ctx->IO).MetricsRenderVertices;
      *piVar1 = *piVar1 + iVar19;
      piVar1 = &(ctx->IO).MetricsRenderIndices;
      *piVar1 = *piVar1 + iVar18;
    }
    CallContextHooks(ctx,ImGuiContextHookType_RenderPost);
    return;
  }
  __assert_fail("g.Initialized",
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                ,0x1297,"void ImGui::Render()");
}

Assistant:

void ImGui::Render()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    if (g.FrameCountEnded != g.FrameCount)
        EndFrame();
    g.FrameCountRendered = g.FrameCount;
    g.IO.MetricsRenderWindows = 0;

    CallContextHooks(&g, ImGuiContextHookType_RenderPre);

    // Add background ImDrawList (for each active viewport)
    for (int n = 0; n != g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataBuilder.Clear();
        if (viewport->DrawLists[0] != NULL)
            AddDrawListToDrawData(&viewport->DrawDataBuilder.Layers[0], GetBackgroundDrawList(viewport));
    }

    // Add ImDrawList to render
    ImGuiWindow* windows_to_render_top_most[2];
    windows_to_render_top_most[0] = (g.NavWindowingTarget && !(g.NavWindowingTarget->Flags & ImGuiWindowFlags_NoBringToFrontOnFocus)) ? g.NavWindowingTarget->RootWindowDockTree : NULL;
    windows_to_render_top_most[1] = (g.NavWindowingTarget ? g.NavWindowingListWindow : NULL);
    for (int n = 0; n != g.Windows.Size; n++)
    {
        ImGuiWindow* window = g.Windows[n];
        IM_MSVC_WARNING_SUPPRESS(6011); // Static Analysis false positive "warning C6011: Dereferencing NULL pointer 'window'"
        if (IsWindowActiveAndVisible(window) && (window->Flags & ImGuiWindowFlags_ChildWindow) == 0 && window != windows_to_render_top_most[0] && window != windows_to_render_top_most[1])
            AddRootWindowToDrawData(window);
    }
    for (int n = 0; n < IM_ARRAYSIZE(windows_to_render_top_most); n++)
        if (windows_to_render_top_most[n] && IsWindowActiveAndVisible(windows_to_render_top_most[n])) // NavWindowingTarget is always temporarily displayed as the top-most window
            AddRootWindowToDrawData(windows_to_render_top_most[n]);

    ImVec2 mouse_cursor_offset, mouse_cursor_size, mouse_cursor_uv[4];
    if (g.IO.MouseDrawCursor && g.MouseCursor != ImGuiMouseCursor_None)
        g.IO.Fonts->GetMouseCursorTexData(g.MouseCursor, &mouse_cursor_offset, &mouse_cursor_size, &mouse_cursor_uv[0], &mouse_cursor_uv[2]);

    // Setup ImDrawData structures for end-user
    g.IO.MetricsRenderVertices = g.IO.MetricsRenderIndices = 0;
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataBuilder.FlattenIntoSingleLayer();

        // Draw software mouse cursor if requested by io.MouseDrawCursor flag
        // (note we scale cursor by current viewport/monitor, however Windows 10 for its own hardware cursor seems to be using a different scale factor)
        if (mouse_cursor_size.x > 0.0f && mouse_cursor_size.y > 0.0f)
        {
            float scale = g.Style.MouseCursorScale * viewport->DpiScale;
            if (viewport->GetMainRect().Overlaps(ImRect(g.IO.MousePos, g.IO.MousePos + ImVec2(mouse_cursor_size.x + 2, mouse_cursor_size.y + 2) * scale)))
                RenderMouseCursor(GetForegroundDrawList(viewport), g.IO.MousePos, scale, g.MouseCursor, IM_COL32_WHITE, IM_COL32_BLACK, IM_COL32(0, 0, 0, 48));
        }

        // Add foreground ImDrawList (for each active viewport)
        if (viewport->DrawLists[1] != NULL)
            AddDrawListToDrawData(&viewport->DrawDataBuilder.Layers[0], GetForegroundDrawList(viewport));

        SetupViewportDrawData(viewport, &viewport->DrawDataBuilder.Layers[0]);
        ImDrawData* draw_data = viewport->DrawData;
        g.IO.MetricsRenderVertices += draw_data->TotalVtxCount;
        g.IO.MetricsRenderIndices += draw_data->TotalIdxCount;
    }

    CallContextHooks(&g, ImGuiContextHookType_RenderPost);
}